

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matmul_x86.cpp
# Opt level: O2

int __thiscall
ncnn::MatMul_x86::forward
          (MatMul_x86 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  Mat *this_00;
  size_t sVar1;
  Allocator *pAVar2;
  uint uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  void **ppvVar8;
  pointer pMVar9;
  pointer pMVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  pointer pMVar13;
  Option *pOVar14;
  pointer pMVar15;
  int iVar16;
  ulong uVar17;
  ulong uVar18;
  int *piVar19;
  Mat *pMVar20;
  size_t sVar21;
  uint uVar22;
  uint uVar23;
  int iVar24;
  Mat *pMVar25;
  void *pvVar26;
  ulong uVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  ulong uVar32;
  Allocator *pAVar33;
  ulong uVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  Mat local_1c8;
  ulong local_180;
  Allocator *local_178;
  ulong local_170;
  ulong local_168;
  allocator_type local_159;
  Allocator *local_158;
  MatMul_x86 *local_150;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> _bottom_blobs;
  int local_130;
  Allocator *local_128;
  int local_120;
  int aiStack_11c [5];
  size_t local_108;
  Option *local_100;
  Mat *local_f8;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> _bottom_blobs_3;
  int local_d8;
  Allocator *local_d0;
  int local_c8;
  int iStack_c4;
  int iStack_c0;
  int iStack_bc;
  int local_b8;
  size_t local_b0;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> _bottom_blobs_5;
  int local_80;
  Allocator *local_78;
  int local_70;
  int iStack_6c;
  int iStack_68;
  int iStack_64;
  int local_60;
  size_t local_58;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> _top_blobs;
  
  uVar12 = local_1c8.elemsize._4_4_;
  uVar11 = (undefined4)local_1c8.elemsize;
  pMVar20 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pMVar25 = pMVar20 + 1;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  uVar22 = pMVar20->dims;
  uVar23 = pMVar20[1].dims;
  uVar3 = uVar23;
  if ((int)uVar23 < (int)uVar22) {
    uVar3 = uVar22;
  }
  local_150 = this;
  local_100 = opt;
  if ((uVar22 ^ 1) == 0 && (uVar23 ^ 1) == 0) {
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
              (&_bottom_blobs,2,(allocator_type *)&local_1c8);
    Mat::reshape(&local_1c8,pMVar20,pMVar20->w,1,(Allocator *)0x0);
    pMVar9 = _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar19 = (int *)CONCAT44(local_1c8.refcount._4_4_,local_1c8.refcount._0_4_);
    if (_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start != &local_1c8) {
      if (piVar19 != (int *)0x0) {
        LOCK();
        *piVar19 = *piVar19 + 1;
        UNLOCK();
      }
      piVar19 = (_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                 super__Vector_impl_data._M_start)->refcount;
      if (piVar19 != (int *)0x0) {
        LOCK();
        *piVar19 = *piVar19 + -1;
        UNLOCK();
        if (*piVar19 == 0) {
          if ((_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
               super__Vector_impl_data._M_start)->allocator == (Allocator *)0x0) {
            free((_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                  super__Vector_impl_data._M_start)->data);
          }
          else {
            (*(_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
               super__Vector_impl_data._M_start)->allocator->_vptr_Allocator[3])();
          }
        }
      }
      pMVar9->cstep = 0;
      pMVar9->data = (void *)0x0;
      pMVar9->refcount = (int *)0x0;
      *(undefined8 *)((long)&pMVar9->refcount + 4) = 0;
      *(undefined8 *)((long)&pMVar9->elemsize + 4) = 0;
      pMVar9->dims = 0;
      pMVar9->w = 0;
      pMVar9->h = 0;
      pMVar9->d = 0;
      pMVar9->c = 0;
      pMVar9->data = local_1c8.data;
      piVar19 = (int *)CONCAT44(local_1c8.refcount._4_4_,local_1c8.refcount._0_4_);
      pMVar9->refcount = piVar19;
      pMVar9->elemsize = CONCAT44(local_1c8.elemsize._4_4_,(undefined4)local_1c8.elemsize);
      pMVar9->elempack = local_1c8.elempack;
      pMVar9->allocator = local_1c8.allocator;
      pMVar9->dims = local_1c8.dims;
      pMVar9->w = local_1c8.w;
      pMVar9->h = local_1c8.h;
      pMVar9->d = local_1c8.d;
      pMVar9->c = local_1c8.c;
      pMVar9->cstep = local_1c8.cstep;
    }
    if (piVar19 != (int *)0x0) {
      LOCK();
      *piVar19 = *piVar19 + -1;
      UNLOCK();
      if (*piVar19 == 0) {
        if (local_1c8.allocator == (Allocator *)0x0) {
          free(local_1c8.data);
        }
        else {
          (*(local_1c8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    iVar16 = 1;
    iVar31 = pMVar20[1].w;
    if ((local_150->super_MatMul).transB == 0) {
      iVar16 = pMVar20[1].w;
      iVar31 = 1;
    }
    Mat::reshape(&local_1c8,pMVar25,iVar31,iVar16,(Allocator *)0x0);
    pOVar14 = local_100;
    piVar19 = (int *)CONCAT44(local_1c8.refcount._4_4_,local_1c8.refcount._0_4_);
    if (_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start + 1 != &local_1c8) {
      if (piVar19 != (int *)0x0) {
        LOCK();
        *piVar19 = *piVar19 + 1;
        UNLOCK();
      }
      piVar19 = _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_start[1].refcount;
      if (piVar19 != (int *)0x0) {
        LOCK();
        *piVar19 = *piVar19 + -1;
        UNLOCK();
        if (*piVar19 == 0) {
          if (_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
              super__Vector_impl_data._M_start[1].allocator == (Allocator *)0x0) {
            free(_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                 super__Vector_impl_data._M_start[1].data);
          }
          else {
            (*(_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
               super__Vector_impl_data._M_start[1].allocator)->_vptr_Allocator[3])();
          }
        }
      }
      _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_start[1].data = local_1c8.data;
      piVar19 = (int *)CONCAT44(local_1c8.refcount._4_4_,local_1c8.refcount._0_4_);
      _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_start[1].refcount = piVar19;
      _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_start[1].elemsize =
           CONCAT44(local_1c8.elemsize._4_4_,(undefined4)local_1c8.elemsize);
      _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_start[1].elempack = local_1c8.elempack;
      _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_start[1].allocator = local_1c8.allocator;
      _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_start[1].dims = local_1c8.dims;
      _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_start[1].w = local_1c8.w;
      _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_start[1].h = local_1c8.h;
      _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_start[1].d = local_1c8.d;
      _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_start[1].c = local_1c8.c;
      _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_start[1].cstep = local_1c8.cstep;
    }
    if (piVar19 != (int *)0x0) {
      LOCK();
      *piVar19 = *piVar19 + -1;
      UNLOCK();
      if (*piVar19 == 0) {
        if (local_1c8.allocator == (Allocator *)0x0) {
          free(local_1c8.data);
        }
        else {
          (*(local_1c8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    (*local_150->gemm->_vptr_Layer[6])(local_150->gemm,&_bottom_blobs,top_blobs,pOVar14);
    Mat::reshape(&local_1c8,this_00,1,pOVar14->blob_allocator);
    piVar19 = (int *)CONCAT44(local_1c8.refcount._4_4_,local_1c8.refcount._0_4_);
    if (this_00 != &local_1c8) {
      if (piVar19 != (int *)0x0) {
        LOCK();
        *piVar19 = *piVar19 + 1;
        UNLOCK();
      }
      piVar19 = this_00->refcount;
      if (piVar19 != (int *)0x0) {
        LOCK();
        *piVar19 = *piVar19 + -1;
        UNLOCK();
        if (*piVar19 == 0) {
          if (this_00->allocator == (Allocator *)0x0) {
            free(this_00->data);
          }
          else {
            (*this_00->allocator->_vptr_Allocator[3])();
          }
        }
      }
      this_00->data = local_1c8.data;
      piVar19 = (int *)CONCAT44(local_1c8.refcount._4_4_,local_1c8.refcount._0_4_);
      this_00->refcount = piVar19;
      this_00->elemsize = CONCAT44(local_1c8.elemsize._4_4_,(undefined4)local_1c8.elemsize);
      this_00->elempack = local_1c8.elempack;
      this_00->allocator = local_1c8.allocator;
      this_00->dims = local_1c8.dims;
      this_00->w = local_1c8.w;
      this_00->h = local_1c8.h;
      this_00->d = local_1c8.d;
      this_00->c = local_1c8.c;
      this_00->cstep = local_1c8.cstep;
    }
    if (piVar19 == (int *)0x0) goto LAB_004e471f;
    LOCK();
    *piVar19 = *piVar19 + -1;
    UNLOCK();
    if (*piVar19 != 0) goto LAB_004e471f;
    if (local_1c8.allocator != (Allocator *)0x0) {
      (*(local_1c8.allocator)->_vptr_Allocator[3])();
      goto LAB_004e471f;
    }
  }
  else {
    if ((uVar22 ^ 2) == 0 && (uVar23 ^ 2) == 0) {
      (*this->gemm->_vptr_Layer[6])(this->gemm,bottom_blobs,top_blobs,opt);
      return 0;
    }
    if ((uVar22 ^ 1) == 0 && (uVar23 ^ 2) == 0) {
      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
                (&_bottom_blobs,2,(allocator_type *)&local_1c8);
      Mat::reshape(&local_1c8,pMVar20,pMVar20->w,1,(Allocator *)0x0);
      pOVar14 = local_100;
      pMVar9 = _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar19 = (int *)CONCAT44(local_1c8.refcount._4_4_,local_1c8.refcount._0_4_);
      if (_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
          super__Vector_impl_data._M_start != &local_1c8) {
        if (piVar19 != (int *)0x0) {
          LOCK();
          *piVar19 = *piVar19 + 1;
          UNLOCK();
        }
        piVar19 = (_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                   super__Vector_impl_data._M_start)->refcount;
        if (piVar19 != (int *)0x0) {
          LOCK();
          *piVar19 = *piVar19 + -1;
          UNLOCK();
          if (*piVar19 == 0) {
            if ((_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                 super__Vector_impl_data._M_start)->allocator == (Allocator *)0x0) {
              free((_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                    super__Vector_impl_data._M_start)->data);
            }
            else {
              (*(_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                 super__Vector_impl_data._M_start)->allocator->_vptr_Allocator[3])();
            }
          }
        }
        pMVar9->cstep = 0;
        pMVar9->data = (void *)0x0;
        pMVar9->refcount = (int *)0x0;
        *(undefined8 *)((long)&pMVar9->refcount + 4) = 0;
        *(undefined8 *)((long)&pMVar9->elemsize + 4) = 0;
        pMVar9->dims = 0;
        pMVar9->w = 0;
        pMVar9->h = 0;
        pMVar9->d = 0;
        pMVar9->c = 0;
        pMVar9->data = local_1c8.data;
        piVar19 = (int *)CONCAT44(local_1c8.refcount._4_4_,local_1c8.refcount._0_4_);
        pMVar9->refcount = piVar19;
        pMVar9->elemsize = CONCAT44(local_1c8.elemsize._4_4_,(undefined4)local_1c8.elemsize);
        pMVar9->elempack = local_1c8.elempack;
        pMVar9->allocator = local_1c8.allocator;
        pMVar9->dims = local_1c8.dims;
        pMVar9->w = local_1c8.w;
        pMVar9->h = local_1c8.h;
        pMVar9->d = local_1c8.d;
        pMVar9->c = local_1c8.c;
        pMVar9->cstep = local_1c8.cstep;
      }
      if (piVar19 != (int *)0x0) {
        LOCK();
        *piVar19 = *piVar19 + -1;
        UNLOCK();
        if (*piVar19 == 0) {
          if (local_1c8.allocator == (Allocator *)0x0) {
            free(local_1c8.data);
          }
          else {
            (*(local_1c8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      if (_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
          super__Vector_impl_data._M_start != pMVar20) {
        piVar19 = pMVar20[1].refcount;
        if (piVar19 != (int *)0x0) {
          LOCK();
          *piVar19 = *piVar19 + 1;
          UNLOCK();
        }
        piVar19 = _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                  super__Vector_impl_data._M_start[1].refcount;
        if (piVar19 != (int *)0x0) {
          LOCK();
          *piVar19 = *piVar19 + -1;
          UNLOCK();
          if (*piVar19 == 0) {
            if (_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_start[1].allocator == (Allocator *)0x0) {
              free(_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                   super__Vector_impl_data._M_start[1].data);
            }
            else {
              (*(_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                 super__Vector_impl_data._M_start[1].allocator)->_vptr_Allocator[3])();
            }
          }
        }
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].cstep = 0;
        *(undefined8 *)
         ((long)&_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                 super__Vector_impl_data._M_start[1].refcount + 4) = 0;
        *(undefined8 *)
         ((long)&_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                 super__Vector_impl_data._M_start[1].elemsize + 4) = 0;
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].data = (void *)0x0;
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].refcount = (int *)0x0;
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].c = 0;
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].dims = 0;
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].w = 0;
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].h = 0;
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].d = 0;
        piVar19 = pMVar20[1].refcount;
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].data = pMVar20[1].data;
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].refcount = piVar19;
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].elemsize = pMVar20[1].elemsize;
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].elempack = pMVar20[1].elempack;
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].allocator = pMVar20[1].allocator;
        iVar31 = pMVar20[1].w;
        iVar16 = pMVar20[1].h;
        iVar24 = pMVar20[1].d;
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].dims = pMVar20[1].dims;
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].w = iVar31;
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].h = iVar16;
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].d = iVar24;
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].c = pMVar20[1].c;
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].cstep = pMVar20[1].cstep;
      }
      (*local_150->gemm->_vptr_Layer[6])(local_150->gemm,&_bottom_blobs,top_blobs,pOVar14);
      Mat::reshape(&local_1c8,this_00,this_00->w,pOVar14->blob_allocator);
      piVar19 = (int *)CONCAT44(local_1c8.refcount._4_4_,local_1c8.refcount._0_4_);
      if (this_00 != &local_1c8) {
        if (piVar19 != (int *)0x0) {
          LOCK();
          *piVar19 = *piVar19 + 1;
          UNLOCK();
        }
        piVar19 = this_00->refcount;
        if (piVar19 != (int *)0x0) {
          LOCK();
          *piVar19 = *piVar19 + -1;
          UNLOCK();
          if (*piVar19 == 0) {
            if (this_00->allocator == (Allocator *)0x0) {
              free(this_00->data);
            }
            else {
              (*this_00->allocator->_vptr_Allocator[3])();
            }
          }
        }
        this_00->data = local_1c8.data;
        piVar19 = (int *)CONCAT44(local_1c8.refcount._4_4_,local_1c8.refcount._0_4_);
        this_00->refcount = piVar19;
        this_00->elemsize = CONCAT44(local_1c8.elemsize._4_4_,(undefined4)local_1c8.elemsize);
        this_00->elempack = local_1c8.elempack;
        this_00->allocator = local_1c8.allocator;
        this_00->dims = local_1c8.dims;
        this_00->w = local_1c8.w;
        this_00->h = local_1c8.h;
        this_00->d = local_1c8.d;
        this_00->c = local_1c8.c;
        this_00->cstep = local_1c8.cstep;
      }
      if (piVar19 == (int *)0x0) goto LAB_004e471f;
      LOCK();
      *piVar19 = *piVar19 + -1;
      UNLOCK();
      if (*piVar19 != 0) goto LAB_004e471f;
      if (local_1c8.allocator != (Allocator *)0x0) {
        (*(local_1c8.allocator)->_vptr_Allocator[3])();
        goto LAB_004e471f;
      }
    }
    else {
      if ((uVar22 ^ 2) != 0 || (uVar23 ^ 1) != 0) {
        sVar1 = pMVar20->elemsize;
        if ((int)uVar23 < 3 || uVar22 != 1) {
          if ((int)uVar22 < 3 || uVar23 != 1) {
            local_1c8.elemsize._0_4_ = (undefined4)sVar1;
            local_1c8.elemsize._4_4_ = (undefined4)(sVar1 >> 0x20);
            if (uVar3 == 4) {
              if (uVar22 == 3) {
                local_1c8.elemsize._0_4_ = uVar11;
                local_1c8.elemsize._4_4_ = uVar12;
                Mat::reshape(&local_1c8,pMVar20,pMVar20->w,pMVar20->h,pMVar20->c,1,(Allocator *)0x0)
                ;
              }
              else {
                local_1c8.data = pMVar20->data;
                piVar19 = pMVar20->refcount;
                local_1c8.refcount._0_4_ = SUB84(piVar19,0);
                local_1c8.refcount._4_4_ = (undefined4)((ulong)piVar19 >> 0x20);
                local_1c8.elempack = pMVar20->elempack;
                local_1c8.allocator = pMVar20->allocator;
                uVar6 = pMVar20->w;
                uVar7 = pMVar20->h;
                local_1c8.d = pMVar20->d;
                local_1c8.c = pMVar20->c;
                local_1c8.cstep = pMVar20->cstep;
                local_1c8.dims = uVar22;
                local_1c8.w = uVar6;
                local_1c8.h = uVar7;
                if (piVar19 != (int *)0x0) {
                  LOCK();
                  *piVar19 = *piVar19 + 1;
                  UNLOCK();
                }
              }
              if (uVar23 == 3) {
                Mat::reshape((Mat *)&_bottom_blobs,pMVar25,pMVar20[1].w,pMVar20[1].h,pMVar20[1].c,1,
                             (Allocator *)0x0);
              }
              else {
                _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)pMVar20[1].data;
                _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)pMVar20[1].refcount;
                _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)pMVar20[1].elemsize;
                local_130 = pMVar20[1].elempack;
                local_128 = pMVar20[1].allocator;
                local_120 = pMVar20[1].dims;
                aiStack_11c[0] = pMVar20[1].w;
                aiStack_11c[1] = pMVar20[1].h;
                aiStack_11c[2] = pMVar20[1].d;
                aiStack_11c[3] = pMVar20[1].c;
                local_108 = pMVar20[1].cstep;
                if (_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                    super__Vector_impl_data._M_finish != (pointer)0x0) {
                  LOCK();
                  *(int *)&(_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                            _M_impl.super__Vector_impl_data._M_finish)->data =
                       *(int *)&(_bottom_blobs.
                                 super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                 super__Vector_impl_data._M_finish)->data + 1;
                  UNLOCK();
                }
              }
              uVar22 = aiStack_11c[2];
              if (aiStack_11c[2] < local_1c8.d) {
                uVar22 = local_1c8.d;
              }
              uVar27 = (ulong)uVar22;
              uVar23 = aiStack_11c[3];
              if (aiStack_11c[3] < local_1c8.c) {
                uVar23 = local_1c8.c;
              }
              pMVar25 = (Mat *)(ulong)uVar23;
              Mat::create(this_00,aiStack_11c[(local_150->super_MatMul).transB != 0],local_1c8.h,
                          uVar22,uVar23,sVar1,opt->blob_allocator);
              if ((this_00->data == (void *)0x0) || ((long)this_00->c * this_00->cstep == 0)) {
                if (_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                    super__Vector_impl_data._M_finish != (pointer)0x0) {
                  LOCK();
                  *(int *)&(_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                            _M_impl.super__Vector_impl_data._M_finish)->data =
                       *(int *)&(_bottom_blobs.
                                 super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                 super__Vector_impl_data._M_finish)->data + -1;
                  UNLOCK();
                  if (*(int *)&(_bottom_blobs.
                                super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                super__Vector_impl_data._M_finish)->data == 0) {
                    if (local_128 == (Allocator *)0x0) {
                      free(_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                           _M_impl.super__Vector_impl_data._M_start);
                    }
                    else {
                      (*local_128->_vptr_Allocator[3])();
                    }
                  }
                }
                piVar19 = (int *)CONCAT44(local_1c8.refcount._4_4_,local_1c8.refcount._0_4_);
                if (piVar19 == (int *)0x0) {
                  return -100;
                }
                LOCK();
                *piVar19 = *piVar19 + -1;
                UNLOCK();
                if (*piVar19 != 0) {
                  return -100;
                }
                if (local_1c8.allocator != (Allocator *)0x0) {
                  (*(local_1c8.allocator)->_vptr_Allocator[3])();
                  return -100;
                }
                goto LAB_004e5365;
              }
              if ((int)uVar22 < 1) {
                uVar27 = 0;
              }
              if ((int)uVar23 < 1) {
                pMVar25 = (Mat *)0x0;
              }
              pMVar20 = (Mat *)0x0;
              local_170 = uVar27;
              while (pMVar20 != pMVar25) {
                local_180 = (ulong)pMVar20 & 0xffffffff;
                local_168 = local_180;
                if (local_1c8.c == 1) {
                  local_168 = 0;
                }
                if (aiStack_11c[3] == 1) {
                  local_180 = 0;
                }
                uVar27 = 0;
                local_f8 = pMVar20;
                while( true ) {
                  if (local_170 == uVar27) break;
                  iVar24 = local_1c8.d;
                  iVar29 = aiStack_11c[2];
                  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
                            (&_bottom_blobs_5,2,(allocator_type *)&_bottom_blobs_3);
                  pMVar9 = _bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  iVar16 = local_1c8.h;
                  iVar31 = local_1c8.w;
                  pvVar26 = local_1c8.data;
                  lVar37 = (long)local_1c8.w;
                  lVar36 = (long)local_1c8.h;
                  lVar35 = local_1c8.cstep * local_168;
                  sVar1 = CONCAT44(local_1c8.elemsize._4_4_,(undefined4)local_1c8.elemsize);
                  uVar34 = uVar27;
                  if (iVar24 == 1) {
                    uVar34 = 0;
                  }
                  piVar19 = (_bottom_blobs_5.
                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                             super__Vector_impl_data._M_start)->refcount;
                  pAVar33 = local_1c8.allocator;
                  iVar24 = local_1c8.elempack;
                  if (piVar19 != (int *)0x0) {
                    LOCK();
                    *piVar19 = *piVar19 + -1;
                    UNLOCK();
                    if (*piVar19 == 0) {
                      local_158 = local_1c8.allocator;
                      local_178 = (Allocator *)CONCAT44(local_178._4_4_,local_1c8.elempack);
                      if ((_bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                           ._M_impl.super__Vector_impl_data._M_start)->allocator == (Allocator *)0x0
                         ) {
                        free((_bottom_blobs_5.
                              super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                              super__Vector_impl_data._M_start)->data);
                        pAVar33 = local_158;
                        iVar24 = (int)local_178;
                      }
                      else {
                        (*(_bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                           ._M_impl.super__Vector_impl_data._M_start)->allocator->_vptr_Allocator[3]
                        )();
                        pAVar33 = local_158;
                        iVar24 = (int)local_178;
                      }
                    }
                  }
                  pMVar15 = _bottom_blobs_5.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                            super__Vector_impl_data._M_start;
                  pMVar10 = _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage;
                  pMVar13 = _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                            _M_impl.super__Vector_impl_data._M_start;
                  pMVar9->data = (void *)((long)pvVar26 +
                                         uVar34 * lVar36 * lVar37 * sVar1 + lVar35 * sVar1);
                  pMVar9->refcount = (int *)0x0;
                  pMVar9->elemsize = sVar1;
                  pMVar9->elempack = iVar24;
                  pMVar9->allocator = pAVar33;
                  pMVar9->dims = 2;
                  pMVar9->w = iVar31;
                  pMVar9->h = iVar16;
                  pMVar9->d = 1;
                  pMVar9->c = 1;
                  pMVar9->cstep = lVar36 * lVar37;
                  iVar31 = aiStack_11c[1];
                  lVar35 = (long)aiStack_11c[1];
                  lVar37 = local_108 * local_180 *
                           (long)_bottom_blobs.
                                 super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage;
                  piVar19 = _bottom_blobs_5.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                            super__Vector_impl_data._M_start[1].refcount;
                  uVar34 = uVar27;
                  if (iVar29 == 1) {
                    uVar34 = 0;
                  }
                  pAVar33 = local_128;
                  if (piVar19 != (int *)0x0) {
                    LOCK();
                    *piVar19 = *piVar19 + -1;
                    UNLOCK();
                    if (*piVar19 == 0) {
                      local_178 = local_128;
                      if (_bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                          _M_impl.super__Vector_impl_data._M_start[1].allocator == (Allocator *)0x0)
                      {
                        free(_bottom_blobs_5.
                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                             super__Vector_impl_data._M_start[1].data);
                        pAVar33 = local_178;
                      }
                      else {
                        (*(_bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                           ._M_impl.super__Vector_impl_data._M_start[1].allocator)->_vptr_Allocator
                          [3])();
                        pAVar33 = local_178;
                      }
                    }
                  }
                  pMVar15[1].data =
                       (void *)((long)&pMVar13->data +
                               uVar34 * lVar35 * aiStack_11c[0] * (long)pMVar10 + lVar37);
                  pMVar15[1].refcount = (int *)0x0;
                  pMVar15[1].elemsize = (size_t)pMVar10;
                  pMVar15[1].elempack = local_130;
                  pMVar15[1].allocator = pAVar33;
                  pMVar15[1].dims = 2;
                  pMVar15[1].w = aiStack_11c[0];
                  pMVar15[1].h = iVar31;
                  pMVar15[1].d = 1;
                  pMVar15[1].c = 1;
                  pMVar15[1].cstep = lVar35 * aiStack_11c[0];
                  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
                            (&_bottom_blobs_3,1,(allocator_type *)&_top_blobs);
                  pMVar9 = _bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  iVar31 = this_00->w;
                  iVar16 = this_00->h;
                  lVar37 = this_00->cstep * (long)local_f8;
                  sVar1 = this_00->elemsize;
                  pvVar26 = this_00->data;
                  iVar24 = this_00->elempack;
                  pAVar33 = this_00->allocator;
                  piVar19 = (_bottom_blobs_3.
                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                             super__Vector_impl_data._M_start)->refcount;
                  if (piVar19 != (int *)0x0) {
                    LOCK();
                    *piVar19 = *piVar19 + -1;
                    UNLOCK();
                    if (*piVar19 == 0) {
                      if ((_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                           ._M_impl.super__Vector_impl_data._M_start)->allocator == (Allocator *)0x0
                         ) {
                        free((_bottom_blobs_3.
                              super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                              super__Vector_impl_data._M_start)->data);
                      }
                      else {
                        (*(_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                           ._M_impl.super__Vector_impl_data._M_start)->allocator->_vptr_Allocator[3]
                        )();
                      }
                    }
                  }
                  sVar21 = (long)iVar16 * (long)iVar31;
                  pMVar9->data = (void *)((long)pvVar26 + uVar27 * sVar1 * sVar21 + lVar37 * sVar1);
                  pMVar9->refcount = (int *)0x0;
                  pMVar9->elemsize = sVar1;
                  pMVar9->elempack = iVar24;
                  pMVar9->allocator = pAVar33;
                  pMVar9->dims = 2;
                  pMVar9->w = iVar31;
                  pMVar9->h = iVar16;
                  pMVar9->d = 1;
                  pMVar9->c = 1;
                  pMVar9->cstep = sVar21;
                  (*local_150->gemm->_vptr_Layer[6])
                            (local_150->gemm,&_bottom_blobs_5,&_bottom_blobs_3,local_100);
                  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&_bottom_blobs_3);
                  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&_bottom_blobs_5);
                  uVar27 = uVar27 + 1;
                }
                pMVar20 = (Mat *)((long)&local_f8->data + 1);
              }
              if (_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                  super__Vector_impl_data._M_finish != (pointer)0x0) {
                LOCK();
                *(int *)&(_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                          _M_impl.super__Vector_impl_data._M_finish)->data =
                     *(int *)&(_bottom_blobs.
                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                               super__Vector_impl_data._M_finish)->data + -1;
                UNLOCK();
                if (*(int *)&(_bottom_blobs.
                              super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                              super__Vector_impl_data._M_finish)->data == 0) {
                  if (local_128 == (Allocator *)0x0) {
                    free(_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                         _M_impl.super__Vector_impl_data._M_start);
                  }
                  else {
                    (*local_128->_vptr_Allocator[3])();
                  }
                }
              }
              piVar19 = (int *)CONCAT44(local_1c8.refcount._4_4_,local_1c8.refcount._0_4_);
              if (piVar19 == (int *)0x0) {
                return 0;
              }
              LOCK();
              *piVar19 = *piVar19 + -1;
              UNLOCK();
              if (*piVar19 != 0) {
                return 0;
              }
              if (local_1c8.allocator != (Allocator *)0x0) {
                (*(local_1c8.allocator)->_vptr_Allocator[3])();
                return 0;
              }
            }
            else {
              if (uVar3 != 3) {
                fprintf(_stderr,"impossible matmul %d %d",(ulong)uVar22,(ulong)uVar23);
                fputc(10,_stderr);
                return -1;
              }
              if (uVar22 == 2) {
                local_1c8.elemsize._0_4_ = uVar11;
                local_1c8.elemsize._4_4_ = uVar12;
                Mat::reshape(&local_1c8,pMVar20,pMVar20->w,pMVar20->h,1,(Allocator *)0x0);
              }
              else {
                local_1c8.data = pMVar20->data;
                piVar19 = pMVar20->refcount;
                local_1c8.refcount._0_4_ = SUB84(piVar19,0);
                local_1c8.refcount._4_4_ = (undefined4)((ulong)piVar19 >> 0x20);
                local_1c8.elempack = pMVar20->elempack;
                local_1c8.allocator = pMVar20->allocator;
                uVar4 = pMVar20->w;
                uVar5 = pMVar20->h;
                local_1c8.d = pMVar20->d;
                local_1c8.c = pMVar20->c;
                local_1c8.cstep = pMVar20->cstep;
                local_1c8.dims = uVar22;
                local_1c8.w = uVar4;
                local_1c8.h = uVar5;
                if (piVar19 != (int *)0x0) {
                  LOCK();
                  *piVar19 = *piVar19 + 1;
                  UNLOCK();
                }
              }
              if (uVar23 == 2) {
                Mat::reshape((Mat *)&_bottom_blobs,pMVar25,pMVar20[1].w,pMVar20[1].h,1,
                             (Allocator *)0x0);
              }
              else {
                _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)pMVar20[1].data;
                _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)pMVar20[1].refcount;
                _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)pMVar20[1].elemsize;
                local_130 = pMVar20[1].elempack;
                local_128 = pMVar20[1].allocator;
                local_120 = pMVar20[1].dims;
                aiStack_11c[0] = pMVar20[1].w;
                aiStack_11c[1] = pMVar20[1].h;
                aiStack_11c[2] = pMVar20[1].d;
                aiStack_11c[3] = pMVar20[1].c;
                local_108 = pMVar20[1].cstep;
                if (_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                    super__Vector_impl_data._M_finish != (pointer)0x0) {
                  LOCK();
                  *(int *)&(_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                            _M_impl.super__Vector_impl_data._M_finish)->data =
                       *(int *)&(_bottom_blobs.
                                 super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                 super__Vector_impl_data._M_finish)->data + 1;
                  UNLOCK();
                }
              }
              uVar22 = aiStack_11c[3];
              if (aiStack_11c[3] < local_1c8.c) {
                uVar22 = local_1c8.c;
              }
              pMVar25 = (Mat *)(ulong)uVar22;
              Mat::create(this_00,aiStack_11c[(local_150->super_MatMul).transB != 0],local_1c8.h,
                          uVar22,sVar1,opt->blob_allocator);
              if ((this_00->data == (void *)0x0) || ((long)this_00->c * this_00->cstep == 0)) {
                if (_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                    super__Vector_impl_data._M_finish != (pointer)0x0) {
                  LOCK();
                  *(int *)&(_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                            _M_impl.super__Vector_impl_data._M_finish)->data =
                       *(int *)&(_bottom_blobs.
                                 super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                 super__Vector_impl_data._M_finish)->data + -1;
                  UNLOCK();
                  if (*(int *)&(_bottom_blobs.
                                super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                super__Vector_impl_data._M_finish)->data == 0) {
                    if (local_128 == (Allocator *)0x0) {
                      free(_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                           _M_impl.super__Vector_impl_data._M_start);
                    }
                    else {
                      (*local_128->_vptr_Allocator[3])();
                    }
                  }
                }
                piVar19 = (int *)CONCAT44(local_1c8.refcount._4_4_,local_1c8.refcount._0_4_);
                if (piVar19 == (int *)0x0) {
                  return -100;
                }
                LOCK();
                *piVar19 = *piVar19 + -1;
                UNLOCK();
                if (*piVar19 != 0) {
                  return -100;
                }
                if (local_1c8.allocator != (Allocator *)0x0) {
                  (*(local_1c8.allocator)->_vptr_Allocator[3])();
                  return -100;
                }
LAB_004e5365:
                free(local_1c8.data);
                return -100;
              }
              if ((int)uVar22 < 1) {
                pMVar25 = (Mat *)0x0;
              }
              pMVar20 = (Mat *)0x0;
              local_f8 = pMVar25;
              while( true ) {
                iVar31 = aiStack_11c[3];
                if (local_f8 == pMVar20) break;
                iVar29 = local_1c8.c;
                std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
                          (&_bottom_blobs_5,2,(allocator_type *)&_bottom_blobs_3);
                pMVar9 = _bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                         _M_impl.super__Vector_impl_data._M_start;
                iVar24 = local_1c8.dims;
                iVar16 = local_1c8.elempack;
                uVar27 = (ulong)local_1c8.w;
                uVar34 = (ulong)local_1c8.h;
                pMVar25 = pMVar20;
                if (iVar29 == 1) {
                  pMVar25 = (Mat *)0x0;
                }
                uVar17 = CONCAT44(local_1c8.elemsize._4_4_,(undefined4)local_1c8.elemsize);
                pvVar26 = (void *)((long)pMVar25 * local_1c8.cstep * uVar17 + (long)local_1c8.data);
                uVar18 = (uVar17 * uVar34 * uVar27 + 0xf & 0xfffffffffffffff0) / uVar17;
                if (local_1c8.dims == 4) {
                  uVar18 = uVar34 * uVar27;
                }
                piVar19 = (_bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                           ._M_impl.super__Vector_impl_data._M_start)->refcount;
                pAVar33 = local_1c8.allocator;
                iVar30 = local_1c8.d;
                iVar29 = local_1c8.w;
                iVar28 = local_1c8.h;
                if (piVar19 != (int *)0x0) {
                  LOCK();
                  *piVar19 = *piVar19 + -1;
                  UNLOCK();
                  if (*piVar19 == 0) {
                    local_178 = local_1c8.allocator;
                    local_170 = CONCAT44(local_170._4_4_,local_1c8.d);
                    local_168 = uVar27;
                    local_180 = uVar34;
                    if ((_bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                         _M_impl.super__Vector_impl_data._M_start)->allocator == (Allocator *)0x0) {
                      free((_bottom_blobs_5.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                            super__Vector_impl_data._M_start)->data);
                      iVar29 = (int)local_168;
                      iVar28 = (int)local_180;
                      pAVar33 = local_178;
                      iVar30 = (int)local_170;
                    }
                    else {
                      (*(_bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                         _M_impl.super__Vector_impl_data._M_start)->allocator->_vptr_Allocator[3])()
                      ;
                      iVar29 = (int)local_168;
                      iVar28 = (int)local_180;
                      pAVar33 = local_178;
                      iVar30 = (int)local_170;
                    }
                  }
                }
                pMVar10 = _bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                          _M_impl.super__Vector_impl_data._M_start;
                pMVar13 = _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage;
                pMVar9->refcount = (int *)0x0;
                pMVar9->data = pvVar26;
                pMVar9->elemsize = uVar17;
                pMVar9->elempack = iVar16;
                pMVar9->allocator = pAVar33;
                pMVar9->dims = iVar24 - 1;
                pMVar9->w = iVar29;
                pMVar9->h = iVar28;
                pMVar9->d = 1;
                pMVar9->c = iVar30;
                pMVar9->cstep = uVar18;
                uVar27 = (ulong)aiStack_11c[0];
                iVar16 = aiStack_11c[1];
                pMVar25 = pMVar20;
                if (iVar31 == 1) {
                  pMVar25 = (Mat *)0x0;
                }
                lVar37 = (long)pMVar25 * local_108 *
                         (long)_bottom_blobs.
                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage;
                ppvVar8 = &(_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                            _M_impl.super__Vector_impl_data._M_start)->data;
                uVar17 = (long)_bottom_blobs.
                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage *
                         (long)aiStack_11c[1] * uVar27 + 0xf & 0xfffffffffffffff0;
                uVar34 = uVar17 / (ulong)_bottom_blobs.
                                         super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                         _M_impl.super__Vector_impl_data._M_end_of_storage;
                if (local_120 == 4) {
                  uVar34 = (long)aiStack_11c[1] * uVar27;
                }
                piVar19 = _bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                          _M_impl.super__Vector_impl_data._M_start[1].refcount;
                iVar24 = aiStack_11c[2];
                iVar31 = aiStack_11c[0];
                iVar29 = local_130;
                if (piVar19 != (int *)0x0) {
                  LOCK();
                  *piVar19 = *piVar19 + -1;
                  UNLOCK();
                  if (*piVar19 == 0) {
                    local_180 = CONCAT44(local_180._4_4_,local_130);
                    local_170 = CONCAT44(local_170._4_4_,aiStack_11c[2]);
                    pAVar33 = _bottom_blobs_5.
                              super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                              super__Vector_impl_data._M_start[1].allocator;
                    local_168 = uVar27;
                    if (pAVar33 == (Allocator *)0x0) {
                      free(_bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                           ._M_impl.super__Vector_impl_data._M_start[1].data);
                      iVar31 = (int)local_168;
                      iVar24 = (int)local_170;
                      iVar29 = (int)local_180;
                    }
                    else {
                      (*pAVar33->_vptr_Allocator[3])
                                (pAVar33,_bottom_blobs_5.
                                         super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                         _M_impl.super__Vector_impl_data._M_start[1].data,
                                 uVar17 % (ulong)_bottom_blobs.
                                                 super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                                 ._M_impl.super__Vector_impl_data._M_end_of_storage)
                      ;
                      iVar31 = (int)local_168;
                      iVar24 = (int)local_170;
                      iVar29 = (int)local_180;
                    }
                  }
                }
                pMVar10[1].data = (void **)((long)ppvVar8 + lVar37);
                pMVar10[1].refcount = (int *)0x0;
                pMVar10[1].elemsize = (size_t)pMVar13;
                pMVar10[1].elempack = iVar29;
                pMVar10[1].allocator = local_128;
                pMVar10[1].dims = local_120 + -1;
                pMVar10[1].w = iVar31;
                pMVar10[1].h = iVar16;
                pMVar10[1].d = 1;
                pMVar10[1].c = iVar24;
                pMVar10[1].cstep = uVar34;
                std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
                          (&_bottom_blobs_3,1,(allocator_type *)&_top_blobs);
                pMVar9 = _bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                         _M_impl.super__Vector_impl_data._M_start;
                uVar17 = (ulong)this_00->w;
                iVar31 = this_00->h;
                iVar16 = this_00->d;
                sVar1 = this_00->cstep;
                uVar27 = this_00->elemsize;
                pvVar26 = this_00->data;
                iVar24 = this_00->elempack;
                pAVar33 = this_00->allocator;
                uVar32 = (long)iVar31 * uVar17;
                uVar18 = uVar32 * uVar27 + 0xf & 0xfffffffffffffff0;
                iVar29 = this_00->dims;
                uVar34 = uVar18 / uVar27;
                if (iVar29 == 4) {
                  uVar34 = uVar32;
                }
                piVar19 = (_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                           ._M_impl.super__Vector_impl_data._M_start)->refcount;
                if (piVar19 != (int *)0x0) {
                  LOCK();
                  *piVar19 = *piVar19 + -1;
                  UNLOCK();
                  if (*piVar19 == 0) {
                    local_180 = CONCAT44(local_180._4_4_,iVar24);
                    local_170 = CONCAT44(local_170._4_4_,iVar16);
                    pAVar2 = (_bottom_blobs_3.
                              super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                              super__Vector_impl_data._M_start)->allocator;
                    local_168 = uVar17;
                    if (pAVar2 == (Allocator *)0x0) {
                      free((_bottom_blobs_3.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                            super__Vector_impl_data._M_start)->data);
                      uVar17 = local_168;
                      iVar16 = (int)local_170;
                      iVar24 = (int)local_180;
                    }
                    else {
                      (*pAVar2->_vptr_Allocator[3])
                                (pAVar2,(_bottom_blobs_3.
                                         super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                         _M_impl.super__Vector_impl_data._M_start)->data,
                                 uVar18 % uVar27);
                      uVar17 = local_168;
                      iVar16 = (int)local_170;
                      iVar24 = (int)local_180;
                    }
                  }
                }
                pMVar9->data = (void *)(sVar1 * (long)pMVar20 * uVar27 + (long)pvVar26);
                pMVar9->refcount = (int *)0x0;
                pMVar9->elemsize = uVar27;
                pMVar9->elempack = iVar24;
                pMVar9->allocator = pAVar33;
                pMVar9->dims = iVar29 + -1;
                pMVar9->w = (int)uVar17;
                pMVar9->h = iVar31;
                pMVar9->d = 1;
                pMVar9->c = iVar16;
                pMVar9->cstep = uVar34;
                (*local_150->gemm->_vptr_Layer[6])
                          (local_150->gemm,&_bottom_blobs_5,&_bottom_blobs_3,local_100);
                std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&_bottom_blobs_3);
                std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&_bottom_blobs_5);
                pMVar20 = (Mat *)((long)&pMVar20->data + 1);
              }
              if (_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                  super__Vector_impl_data._M_finish != (pointer)0x0) {
                LOCK();
                *(int *)&(_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                          _M_impl.super__Vector_impl_data._M_finish)->data =
                     *(int *)&(_bottom_blobs.
                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                               super__Vector_impl_data._M_finish)->data + -1;
                UNLOCK();
                if (*(int *)&(_bottom_blobs.
                              super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                              super__Vector_impl_data._M_finish)->data == 0) {
                  if (local_128 == (Allocator *)0x0) {
                    free(_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                         _M_impl.super__Vector_impl_data._M_start);
                  }
                  else {
                    (*local_128->_vptr_Allocator[3])();
                  }
                }
              }
              piVar19 = (int *)CONCAT44(local_1c8.refcount._4_4_,local_1c8.refcount._0_4_);
              if (piVar19 == (int *)0x0) {
                return 0;
              }
              LOCK();
              *piVar19 = *piVar19 + -1;
              UNLOCK();
              if (*piVar19 != 0) {
                return 0;
              }
              if (local_1c8.allocator != (Allocator *)0x0) {
                (*(local_1c8.allocator)->_vptr_Allocator[3])();
                return 0;
              }
            }
            goto LAB_004e57e0;
          }
          iVar31 = pMVar20->h;
          uVar23 = pMVar20->c * pMVar20->d;
          local_170 = (ulong)uVar23;
          local_1c8.cstep = 0;
          local_1c8.data = (void *)0x0;
          local_1c8.refcount._0_4_ = 0;
          local_1c8.refcount._4_4_ = 0;
          local_1c8.elemsize._0_4_ = 0;
          local_1c8.elemsize._4_4_ = 0;
          local_1c8.elempack = 0;
          local_1c8.allocator = (Allocator *)0x0;
          local_1c8.dims = 0;
          local_1c8.w = 0;
          local_1c8.h = 0;
          local_1c8.d = 0;
          local_1c8.c = 0;
          Mat::create(&local_1c8,1,iVar31,uVar23,sVar1,opt->blob_allocator);
          if ((local_1c8.data == (void *)0x0) || ((long)local_1c8.c * local_1c8.cstep == 0)) {
            piVar19 = (int *)CONCAT44(local_1c8.refcount._4_4_,local_1c8.refcount._0_4_);
            if (piVar19 == (int *)0x0) {
              return -100;
            }
            LOCK();
            *piVar19 = *piVar19 + -1;
            UNLOCK();
            if (*piVar19 != 0) {
              return -100;
            }
            if (local_1c8.allocator != (Allocator *)0x0) {
              (*(local_1c8.allocator)->_vptr_Allocator[3])();
              return -100;
            }
            goto LAB_004e5365;
          }
          Mat::reshape((Mat *)&_bottom_blobs,pMVar20,pMVar20->w,pMVar20->h,(int)local_170,
                       (Allocator *)0x0);
          iVar24 = 1;
          iVar16 = pMVar20[1].w;
          if ((local_150->super_MatMul).transB == 0) {
            iVar24 = pMVar20[1].w;
            iVar16 = 1;
          }
          uVar27 = 0;
          Mat::reshape((Mat *)&_bottom_blobs_5,pMVar25,iVar16,iVar24,(Allocator *)0x0);
          iVar16 = (int)local_170;
          local_170 = local_170 & 0xffffffff;
          local_f8 = pMVar20;
          if (iVar16 < 1) {
            local_170 = uVar27;
          }
          for (; local_170 != uVar27; uVar27 = uVar27 + 1) {
            std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
                      (&_bottom_blobs_3,2,(allocator_type *)&_top_blobs);
            pMVar13 = _bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            pMVar9 = _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                     .super__Vector_impl_data._M_end_of_storage;
            uVar18 = (ulong)aiStack_11c[0];
            iVar16 = aiStack_11c[1];
            lVar37 = local_108 * uVar27 *
                     (long)_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage;
            ppvVar8 = &(_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                        _M_impl.super__Vector_impl_data._M_start)->data;
            uVar17 = (long)_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage *
                     (long)aiStack_11c[1] * uVar18 + 0xf & 0xfffffffffffffff0;
            uVar34 = uVar17 / (ulong)_bottom_blobs.
                                     super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                     _M_impl.super__Vector_impl_data._M_end_of_storage;
            if (local_120 == 4) {
              uVar34 = (long)aiStack_11c[1] * uVar18;
            }
            piVar19 = (_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                       _M_impl.super__Vector_impl_data._M_start)->refcount;
            pAVar33 = local_128;
            iVar29 = aiStack_11c[2];
            iVar24 = aiStack_11c[0];
            iVar28 = local_130;
            if (piVar19 != (int *)0x0) {
              LOCK();
              *piVar19 = *piVar19 + -1;
              UNLOCK();
              if (*piVar19 == 0) {
                local_158 = local_128;
                local_178 = (Allocator *)CONCAT44(local_178._4_4_,local_130);
                local_168 = CONCAT44(local_168._4_4_,aiStack_11c[2]);
                pAVar33 = (_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                           ._M_impl.super__Vector_impl_data._M_start)->allocator;
                local_180 = uVar18;
                if (pAVar33 == (Allocator *)0x0) {
                  free((_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                        _M_impl.super__Vector_impl_data._M_start)->data);
                  iVar24 = (int)local_180;
                  pAVar33 = local_158;
                  iVar29 = (uint)local_168;
                  iVar28 = (int)local_178;
                }
                else {
                  (*pAVar33->_vptr_Allocator[3])
                            (pAVar33,(_bottom_blobs_3.
                                      super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                      _M_impl.super__Vector_impl_data._M_start)->data,
                             uVar17 % (ulong)_bottom_blobs.
                                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
                  iVar24 = (int)local_180;
                  pAVar33 = local_158;
                  iVar29 = (uint)local_168;
                  iVar28 = (int)local_178;
                }
              }
            }
            pMVar10 = _bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            pMVar13->data = (void **)((long)ppvVar8 + lVar37);
            pMVar13->refcount = (int *)0x0;
            pMVar13->elemsize = (size_t)pMVar9;
            pMVar13->elempack = iVar28;
            pMVar13->allocator = pAVar33;
            pMVar13->dims = local_120 + -1;
            pMVar13->w = iVar24;
            pMVar13->h = iVar16;
            pMVar13->d = 1;
            pMVar13->c = iVar29;
            pMVar13->cstep = uVar34;
            if (_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_start + 1 != (pointer)&_bottom_blobs_5) {
              if (_bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                  super__Vector_impl_data._M_finish != (pointer)0x0) {
                LOCK();
                *(int *)&(_bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                          _M_impl.super__Vector_impl_data._M_finish)->data =
                     *(int *)&(_bottom_blobs_5.
                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                               super__Vector_impl_data._M_finish)->data + 1;
                UNLOCK();
              }
              piVar19 = _bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                        _M_impl.super__Vector_impl_data._M_start[1].refcount;
              if (piVar19 != (int *)0x0) {
                LOCK();
                *piVar19 = *piVar19 + -1;
                UNLOCK();
                if (*piVar19 == 0) {
                  if (_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_start[1].allocator == (Allocator *)0x0) {
                    free(_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                         _M_impl.super__Vector_impl_data._M_start[1].data);
                  }
                  else {
                    (*(_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                       _M_impl.super__Vector_impl_data._M_start[1].allocator)->_vptr_Allocator[3])()
                    ;
                  }
                }
              }
              pMVar10[1].data =
                   _bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                   .super__Vector_impl_data._M_start;
              pMVar10[1].refcount =
                   (int *)_bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                          _M_impl.super__Vector_impl_data._M_finish;
              pMVar10[1].elemsize =
                   (size_t)_bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
              pMVar10[1].elempack = local_80;
              pMVar10[1].allocator = local_78;
              pMVar10[1].dims = local_70;
              pMVar10[1].w = iStack_6c;
              pMVar10[1].h = iStack_68;
              pMVar10[1].d = iStack_64;
              pMVar10[1].c = local_60;
              pMVar10[1].cstep = local_58;
            }
            std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector(&_top_blobs,1,&local_159);
            pMVar9 = _top_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                     super__Vector_impl_data._M_start;
            iVar24 = local_1c8.h;
            iVar16 = local_1c8.dims;
            uVar32 = (ulong)local_1c8.w;
            uVar34 = CONCAT44(local_1c8.elemsize._4_4_,(undefined4)local_1c8.elemsize);
            pvVar26 = (void *)(local_1c8.cstep * uVar27 * uVar34 + (long)local_1c8.data);
            uVar18 = uVar34 * (long)local_1c8.h * uVar32 + 0xf & 0xfffffffffffffff0;
            uVar17 = uVar18 / uVar34;
            if (local_1c8.dims == 4) {
              uVar17 = (long)local_1c8.h * uVar32;
            }
            piVar19 = (_top_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                       super__Vector_impl_data._M_start)->refcount;
            pAVar33 = local_1c8.allocator;
            iVar28 = local_1c8.d;
            iVar29 = local_1c8.w;
            iVar30 = local_1c8.elempack;
            if (piVar19 != (int *)0x0) {
              LOCK();
              *piVar19 = *piVar19 + -1;
              UNLOCK();
              if (*piVar19 == 0) {
                local_158 = local_1c8.allocator;
                local_178 = (Allocator *)CONCAT44(local_178._4_4_,local_1c8.elempack);
                local_168 = CONCAT44(local_168._4_4_,local_1c8.d);
                pAVar33 = (_top_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                           _M_impl.super__Vector_impl_data._M_start)->allocator;
                local_180 = uVar32;
                if (pAVar33 == (Allocator *)0x0) {
                  free((_top_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                        .super__Vector_impl_data._M_start)->data);
                  iVar29 = (int)local_180;
                  pAVar33 = local_158;
                  iVar28 = (uint)local_168;
                  iVar30 = (int)local_178;
                }
                else {
                  (*pAVar33->_vptr_Allocator[3])
                            (pAVar33,(_top_blobs.
                                      super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                      _M_impl.super__Vector_impl_data._M_start)->data,
                             uVar18 % uVar34);
                  iVar29 = (int)local_180;
                  pAVar33 = local_158;
                  iVar28 = (uint)local_168;
                  iVar30 = (int)local_178;
                }
              }
            }
            opt = local_100;
            pMVar9->data = pvVar26;
            pMVar9->refcount = (int *)0x0;
            pMVar9->elemsize = uVar34;
            pMVar9->elempack = iVar30;
            pMVar9->allocator = pAVar33;
            pMVar9->dims = iVar16 - 1;
            pMVar9->w = iVar29;
            pMVar9->h = iVar24;
            pMVar9->d = 1;
            pMVar9->c = iVar28;
            pMVar9->cstep = uVar17;
            (*local_150->gemm->_vptr_Layer[6])
                      (local_150->gemm,&_bottom_blobs_3,&_top_blobs,local_100);
            std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&_top_blobs);
            std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&_bottom_blobs_3);
          }
          if (uVar22 == 3) {
            Mat::reshape((Mat *)&_bottom_blobs_3,&local_1c8,iVar31,local_f8->c * local_f8->d,
                         opt->blob_allocator);
            if (this_00 != (Mat *)&_bottom_blobs_3) {
              if (_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                  super__Vector_impl_data._M_finish != (pointer)0x0) {
                LOCK();
                *(int *)&(_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                          _M_impl.super__Vector_impl_data._M_finish)->data =
                     *(int *)&(_bottom_blobs_3.
                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                               super__Vector_impl_data._M_finish)->data + 1;
                UNLOCK();
              }
              piVar19 = this_00->refcount;
              if (piVar19 != (int *)0x0) {
                LOCK();
                *piVar19 = *piVar19 + -1;
                UNLOCK();
                if (*piVar19 == 0) {
                  if (this_00->allocator == (Allocator *)0x0) {
                    free(this_00->data);
                  }
                  else {
                    (*this_00->allocator->_vptr_Allocator[3])();
                  }
                }
              }
              this_00->data =
                   _bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                   .super__Vector_impl_data._M_start;
              this_00->refcount =
                   (int *)_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                          _M_impl.super__Vector_impl_data._M_finish;
              this_00->elemsize =
                   (size_t)_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
              this_00->elempack = local_d8;
              this_00->allocator = local_d0;
              this_00->dims = local_c8;
              this_00->w = iStack_c4;
              this_00->h = iStack_c0;
              this_00->d = iStack_bc;
              this_00->c = local_b8;
              this_00->cstep = local_b0;
            }
            if (_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_finish != (pointer)0x0) {
              LOCK();
              *(int *)&(_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                        _M_impl.super__Vector_impl_data._M_finish)->data =
                   *(int *)&(_bottom_blobs_3.
                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                             super__Vector_impl_data._M_finish)->data + -1;
              UNLOCK();
              if (*(int *)&(_bottom_blobs_3.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                            super__Vector_impl_data._M_finish)->data == 0) {
                if (local_d0 == (Allocator *)0x0) {
LAB_004e5739:
                  free(_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                       _M_impl.super__Vector_impl_data._M_start);
                }
                else {
                  (*local_d0->_vptr_Allocator[3])();
                }
              }
            }
          }
          else {
            Mat::reshape((Mat *)&_bottom_blobs_3,&local_1c8,iVar31,local_f8->d,local_f8->c,
                         opt->blob_allocator);
            if (this_00 != (Mat *)&_bottom_blobs_3) {
              if (_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                  super__Vector_impl_data._M_finish != (pointer)0x0) {
                LOCK();
                *(int *)&(_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                          _M_impl.super__Vector_impl_data._M_finish)->data =
                     *(int *)&(_bottom_blobs_3.
                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                               super__Vector_impl_data._M_finish)->data + 1;
                UNLOCK();
              }
              piVar19 = this_00->refcount;
              if (piVar19 != (int *)0x0) {
                LOCK();
                *piVar19 = *piVar19 + -1;
                UNLOCK();
                if (*piVar19 == 0) {
                  if (this_00->allocator == (Allocator *)0x0) {
                    free(this_00->data);
                  }
                  else {
                    (*this_00->allocator->_vptr_Allocator[3])();
                  }
                }
              }
              this_00->data =
                   _bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                   .super__Vector_impl_data._M_start;
              this_00->refcount =
                   (int *)_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                          _M_impl.super__Vector_impl_data._M_finish;
              this_00->elemsize =
                   (size_t)_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
              this_00->elempack = local_d8;
              this_00->allocator = local_d0;
              this_00->dims = local_c8;
              this_00->w = iStack_c4;
              this_00->h = iStack_c0;
              this_00->d = iStack_bc;
              this_00->c = local_b8;
              this_00->cstep = local_b0;
            }
            if (_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_finish != (pointer)0x0) {
              LOCK();
              *(int *)&(_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                        _M_impl.super__Vector_impl_data._M_finish)->data =
                   *(int *)&(_bottom_blobs_3.
                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                             super__Vector_impl_data._M_finish)->data + -1;
              UNLOCK();
              if (*(int *)&(_bottom_blobs_3.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                            super__Vector_impl_data._M_finish)->data == 0) {
                if (local_d0 == (Allocator *)0x0) goto LAB_004e5739;
                (*local_d0->_vptr_Allocator[3])();
              }
            }
          }
          if (_bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
              super__Vector_impl_data._M_finish != (pointer)0x0) {
            LOCK();
            *(int *)&(_bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_finish)->data =
                 *(int *)&(_bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                           ._M_impl.super__Vector_impl_data._M_finish)->data + -1;
            UNLOCK();
            if (*(int *)&(_bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                          _M_impl.super__Vector_impl_data._M_finish)->data == 0) {
              if (local_78 == (Allocator *)0x0) {
                free(_bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                     _M_impl.super__Vector_impl_data._M_start);
              }
              else {
                (*local_78->_vptr_Allocator[3])();
              }
            }
          }
          if (_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
              super__Vector_impl_data._M_finish != (pointer)0x0) {
            LOCK();
            *(int *)&(_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_finish)->data =
                 *(int *)&(_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                           _M_impl.super__Vector_impl_data._M_finish)->data + -1;
            UNLOCK();
            if (*(int *)&(_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                          _M_impl.super__Vector_impl_data._M_finish)->data == 0) {
              if (local_128 == (Allocator *)0x0) {
                free(_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                     .super__Vector_impl_data._M_start);
              }
              else {
                (*local_128->_vptr_Allocator[3])();
              }
            }
          }
          piVar19 = (int *)CONCAT44(local_1c8.refcount._4_4_,local_1c8.refcount._0_4_);
          if (piVar19 == (int *)0x0) {
            return 0;
          }
          LOCK();
          *piVar19 = *piVar19 + -1;
          UNLOCK();
          if (*piVar19 != 0) {
            return 0;
          }
          if (local_1c8.allocator != (Allocator *)0x0) {
            (*(local_1c8.allocator)->_vptr_Allocator[3])();
            return 0;
          }
          goto LAB_004e57e0;
        }
        iVar31 = (&pMVar20[1].w)[(this->super_MatMul).transB != 0];
        uVar22 = pMVar20[1].c * pMVar20[1].d;
        local_170 = (ulong)uVar22;
        local_1c8.cstep = 0;
        local_1c8.data = (void *)0x0;
        local_1c8.refcount._0_4_ = 0;
        local_1c8.refcount._4_4_ = 0;
        local_1c8.elemsize._0_4_ = 0;
        local_1c8.elemsize._4_4_ = 0;
        local_1c8.elempack = 0;
        local_1c8.allocator = (Allocator *)0x0;
        local_1c8.dims = 0;
        local_1c8.w = 0;
        local_1c8.h = 0;
        local_1c8.d = 0;
        local_1c8.c = 0;
        Mat::create(&local_1c8,iVar31,1,uVar22,sVar1,opt->blob_allocator);
        if ((local_1c8.data == (void *)0x0) || ((long)local_1c8.c * local_1c8.cstep == 0)) {
          piVar19 = (int *)CONCAT44(local_1c8.refcount._4_4_,local_1c8.refcount._0_4_);
          if (piVar19 == (int *)0x0) {
            return -100;
          }
          LOCK();
          *piVar19 = *piVar19 + -1;
          UNLOCK();
          if (*piVar19 != 0) {
            return -100;
          }
          if (local_1c8.allocator != (Allocator *)0x0) {
            (*(local_1c8.allocator)->_vptr_Allocator[3])();
            return -100;
          }
          goto LAB_004e5365;
        }
        Mat::reshape((Mat *)&_bottom_blobs,pMVar20,pMVar20->w,1,(Allocator *)0x0);
        uVar27 = local_170;
        iVar16 = (int)local_170;
        Mat::reshape((Mat *)&_bottom_blobs_5,pMVar25,pMVar20[1].w,pMVar20[1].h,iVar16,
                     (Allocator *)0x0);
        local_170 = uVar27 & 0xffffffff;
        if (iVar16 < 1) {
          local_170 = 0;
        }
        local_168 = CONCAT44(local_168._4_4_,uVar23);
        local_f8 = pMVar20;
        for (uVar27 = 0; local_170 != uVar27; uVar27 = uVar27 + 1) {
          std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
                    (&_bottom_blobs_3,2,(allocator_type *)&_top_blobs);
          pMVar9 = _bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                   .super__Vector_impl_data._M_start;
          if (_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)&_bottom_blobs) {
            if (_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_finish != (pointer)0x0) {
              LOCK();
              *(int *)&(_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                        _M_impl.super__Vector_impl_data._M_finish)->data =
                   *(int *)&(_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                             ._M_impl.super__Vector_impl_data._M_finish)->data + 1;
              UNLOCK();
            }
            piVar19 = (_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                       _M_impl.super__Vector_impl_data._M_start)->refcount;
            if (piVar19 != (int *)0x0) {
              LOCK();
              *piVar19 = *piVar19 + -1;
              UNLOCK();
              if (*piVar19 == 0) {
                if ((_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                     _M_impl.super__Vector_impl_data._M_start)->allocator == (Allocator *)0x0) {
                  free((_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                        _M_impl.super__Vector_impl_data._M_start)->data);
                }
                else {
                  (*(_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                     _M_impl.super__Vector_impl_data._M_start)->allocator->_vptr_Allocator[3])();
                }
              }
            }
            pMVar9->cstep = 0;
            pMVar9->data = (void *)0x0;
            pMVar9->refcount = (int *)0x0;
            *(undefined8 *)((long)&pMVar9->refcount + 4) = 0;
            *(undefined8 *)((long)&pMVar9->elemsize + 4) = 0;
            pMVar9->c = 0;
            pMVar9->dims = 0;
            pMVar9->w = 0;
            pMVar9->h = 0;
            pMVar9->d = 0;
            pMVar9->data = _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                           _M_impl.super__Vector_impl_data._M_start;
            pMVar9->refcount =
                 (int *)_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
            pMVar9->elemsize =
                 (size_t)_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage;
            pMVar9->elempack = local_130;
            pMVar9->allocator = local_128;
            pMVar9->dims = local_120;
            pMVar9->w = aiStack_11c[0];
            pMVar9->h = aiStack_11c[1];
            pMVar9->d = aiStack_11c[2];
            pMVar9->c = aiStack_11c[3];
            pMVar9->cstep = local_108;
          }
          pMVar13 = _bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage;
          pMVar9 = _bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                   .super__Vector_impl_data._M_start;
          lVar37 = local_58 * uVar27 *
                   (long)_bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage;
          ppvVar8 = &(_bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_start)->data;
          uVar17 = (long)_bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage *
                   (long)iStack_68 * (long)iStack_6c + 0xfU & 0xfffffffffffffff0;
          uVar34 = uVar17 / (ulong)_bottom_blobs_5.
                                   super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                                   .super__Vector_impl_data._M_end_of_storage;
          if (local_70 == 4) {
            uVar34 = (long)iStack_68 * (long)iStack_6c;
          }
          piVar19 = _bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                    _M_impl.super__Vector_impl_data._M_start[1].refcount;
          pAVar33 = local_78;
          iVar16 = iStack_64;
          iVar24 = local_80;
          if (piVar19 != (int *)0x0) {
            LOCK();
            *piVar19 = *piVar19 + -1;
            UNLOCK();
            if (*piVar19 == 0) {
              local_158 = local_78;
              local_178 = (Allocator *)CONCAT44(local_178._4_4_,local_80);
              local_180 = CONCAT44(local_180._4_4_,iStack_64);
              pAVar33 = _bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                        _M_impl.super__Vector_impl_data._M_start[1].allocator;
              if (pAVar33 == (Allocator *)0x0) {
                free(_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                     _M_impl.super__Vector_impl_data._M_start[1].data);
                pAVar33 = local_158;
                iVar16 = (int)local_180;
                iVar24 = (int)local_178;
              }
              else {
                (*pAVar33->_vptr_Allocator[3])
                          (pAVar33,_bottom_blobs_3.
                                   super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                                   .super__Vector_impl_data._M_start[1].data,
                           uVar17 % (ulong)_bottom_blobs_5.
                                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
                pAVar33 = local_158;
                iVar16 = (int)local_180;
                iVar24 = (int)local_178;
              }
            }
          }
          pMVar9[1].data = (void **)((long)ppvVar8 + lVar37);
          pMVar9[1].refcount = (int *)0x0;
          pMVar9[1].elemsize = (size_t)pMVar13;
          pMVar9[1].elempack = iVar24;
          pMVar9[1].allocator = pAVar33;
          pMVar9[1].dims = local_70 + -1;
          pMVar9[1].w = iStack_6c;
          pMVar9[1].h = iStack_68;
          pMVar9[1].d = 1;
          pMVar9[1].c = iVar16;
          pMVar9[1].cstep = uVar34;
          std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector(&_top_blobs,1,&local_159);
          pMVar9 = _top_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                   super__Vector_impl_data._M_start;
          iVar29 = local_1c8.h;
          iVar24 = local_1c8.w;
          iVar16 = local_1c8.dims;
          uVar34 = CONCAT44(local_1c8.elemsize._4_4_,(undefined4)local_1c8.elemsize);
          pvVar26 = (void *)(local_1c8.cstep * uVar27 * uVar34 + (long)local_1c8.data);
          uVar18 = uVar34 * (long)local_1c8.h * (long)local_1c8.w + 0xf & 0xfffffffffffffff0;
          uVar17 = uVar18 / uVar34;
          if (local_1c8.dims == 4) {
            uVar17 = (long)local_1c8.h * (long)local_1c8.w;
          }
          piVar19 = (_top_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                     super__Vector_impl_data._M_start)->refcount;
          pAVar33 = local_1c8.allocator;
          iVar28 = local_1c8.d;
          iVar30 = local_1c8.elempack;
          if (piVar19 != (int *)0x0) {
            LOCK();
            *piVar19 = *piVar19 + -1;
            UNLOCK();
            if (*piVar19 == 0) {
              local_158 = local_1c8.allocator;
              local_178 = (Allocator *)CONCAT44(local_178._4_4_,local_1c8.elempack);
              local_180 = CONCAT44(local_180._4_4_,local_1c8.d);
              pAVar33 = (_top_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                         _M_impl.super__Vector_impl_data._M_start)->allocator;
              if (pAVar33 == (Allocator *)0x0) {
                free((_top_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                      super__Vector_impl_data._M_start)->data);
                pAVar33 = local_158;
                iVar28 = (int)local_180;
                iVar30 = (int)local_178;
              }
              else {
                (*pAVar33->_vptr_Allocator[3])
                          (pAVar33,(_top_blobs.
                                    super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                    _M_impl.super__Vector_impl_data._M_start)->data,uVar18 % uVar34)
                ;
                pAVar33 = local_158;
                iVar28 = (int)local_180;
                iVar30 = (int)local_178;
              }
            }
          }
          opt = local_100;
          pMVar9->data = pvVar26;
          pMVar9->refcount = (int *)0x0;
          pMVar9->elemsize = uVar34;
          pMVar9->elempack = iVar30;
          pMVar9->allocator = pAVar33;
          pMVar9->dims = iVar16 - 1;
          pMVar9->w = iVar24;
          pMVar9->h = iVar29;
          pMVar9->d = 1;
          pMVar9->c = iVar28;
          pMVar9->cstep = uVar17;
          (*local_150->gemm->_vptr_Layer[6])(local_150->gemm,&_bottom_blobs_3,&_top_blobs,local_100)
          ;
          std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&_top_blobs);
          std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&_bottom_blobs_3);
          uVar23 = (uint)local_168;
        }
        if (uVar23 == 3) {
          Mat::reshape((Mat *)&_bottom_blobs_3,&local_1c8,iVar31,local_f8[1].c * local_f8[1].d,
                       opt->blob_allocator);
          if (this_00 != (Mat *)&_bottom_blobs_3) {
            if (_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_finish != (pointer)0x0) {
              LOCK();
              *(int *)&(_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                        _M_impl.super__Vector_impl_data._M_finish)->data =
                   *(int *)&(_bottom_blobs_3.
                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                             super__Vector_impl_data._M_finish)->data + 1;
              UNLOCK();
            }
            piVar19 = this_00->refcount;
            if (piVar19 != (int *)0x0) {
              LOCK();
              *piVar19 = *piVar19 + -1;
              UNLOCK();
              if (*piVar19 == 0) {
                if (this_00->allocator == (Allocator *)0x0) {
                  free(this_00->data);
                }
                else {
                  (*this_00->allocator->_vptr_Allocator[3])();
                }
              }
            }
            this_00->data =
                 _bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                 super__Vector_impl_data._M_start;
            this_00->refcount =
                 (int *)_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
            this_00->elemsize =
                 (size_t)_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage;
            this_00->elempack = local_d8;
            this_00->allocator = local_d0;
            this_00->dims = local_c8;
            this_00->w = iStack_c4;
            this_00->h = iStack_c0;
            this_00->d = iStack_bc;
            this_00->c = local_b8;
            this_00->cstep = local_b0;
          }
          if (_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
              super__Vector_impl_data._M_finish != (pointer)0x0) {
            LOCK();
            *(int *)&(_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_finish)->data =
                 *(int *)&(_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                           ._M_impl.super__Vector_impl_data._M_finish)->data + -1;
            UNLOCK();
            if (*(int *)&(_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                          _M_impl.super__Vector_impl_data._M_finish)->data == 0) {
              if (local_d0 == (Allocator *)0x0) {
LAB_004e54db:
                free(_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                     _M_impl.super__Vector_impl_data._M_start);
              }
              else {
                (*local_d0->_vptr_Allocator[3])();
              }
            }
          }
        }
        else {
          Mat::reshape((Mat *)&_bottom_blobs_3,&local_1c8,iVar31,local_f8[1].d,local_f8[1].c,
                       opt->blob_allocator);
          if (this_00 != (Mat *)&_bottom_blobs_3) {
            if (_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_finish != (pointer)0x0) {
              LOCK();
              *(int *)&(_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                        _M_impl.super__Vector_impl_data._M_finish)->data =
                   *(int *)&(_bottom_blobs_3.
                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                             super__Vector_impl_data._M_finish)->data + 1;
              UNLOCK();
            }
            piVar19 = this_00->refcount;
            if (piVar19 != (int *)0x0) {
              LOCK();
              *piVar19 = *piVar19 + -1;
              UNLOCK();
              if (*piVar19 == 0) {
                if (this_00->allocator == (Allocator *)0x0) {
                  free(this_00->data);
                }
                else {
                  (*this_00->allocator->_vptr_Allocator[3])();
                }
              }
            }
            this_00->data =
                 _bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                 super__Vector_impl_data._M_start;
            this_00->refcount =
                 (int *)_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
            this_00->elemsize =
                 (size_t)_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage;
            this_00->elempack = local_d8;
            this_00->allocator = local_d0;
            this_00->dims = local_c8;
            this_00->w = iStack_c4;
            this_00->h = iStack_c0;
            this_00->d = iStack_bc;
            this_00->c = local_b8;
            this_00->cstep = local_b0;
          }
          if (_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
              super__Vector_impl_data._M_finish != (pointer)0x0) {
            LOCK();
            *(int *)&(_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_finish)->data =
                 *(int *)&(_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                           ._M_impl.super__Vector_impl_data._M_finish)->data + -1;
            UNLOCK();
            if (*(int *)&(_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                          _M_impl.super__Vector_impl_data._M_finish)->data == 0) {
              if (local_d0 == (Allocator *)0x0) goto LAB_004e54db;
              (*local_d0->_vptr_Allocator[3])();
            }
          }
        }
        if (_bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
            super__Vector_impl_data._M_finish != (pointer)0x0) {
          LOCK();
          *(int *)&(_bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                    _M_impl.super__Vector_impl_data._M_finish)->data =
               *(int *)&(_bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                         _M_impl.super__Vector_impl_data._M_finish)->data + -1;
          UNLOCK();
          if (*(int *)&(_bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                        _M_impl.super__Vector_impl_data._M_finish)->data == 0) {
            if (local_78 == (Allocator *)0x0) {
              free(_bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                   .super__Vector_impl_data._M_start);
            }
            else {
              (*local_78->_vptr_Allocator[3])();
            }
          }
        }
        if (_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
            super__Vector_impl_data._M_finish != (pointer)0x0) {
          LOCK();
          *(int *)&(_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                    super__Vector_impl_data._M_finish)->data =
               *(int *)&(_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                         _M_impl.super__Vector_impl_data._M_finish)->data + -1;
          UNLOCK();
          if (*(int *)&(_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                        _M_impl.super__Vector_impl_data._M_finish)->data == 0) {
            if (local_128 == (Allocator *)0x0) {
              free(_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                   super__Vector_impl_data._M_start);
            }
            else {
              (*local_128->_vptr_Allocator[3])();
            }
          }
        }
        piVar19 = (int *)CONCAT44(local_1c8.refcount._4_4_,local_1c8.refcount._0_4_);
        if (piVar19 == (int *)0x0) {
          return 0;
        }
        LOCK();
        *piVar19 = *piVar19 + -1;
        UNLOCK();
        if (*piVar19 != 0) {
          return 0;
        }
        if (local_1c8.allocator != (Allocator *)0x0) {
          (*(local_1c8.allocator)->_vptr_Allocator[3])();
          return 0;
        }
LAB_004e57e0:
        free(local_1c8.data);
        return 0;
      }
      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
                (&_bottom_blobs,2,(allocator_type *)&local_1c8);
      pMVar9 = _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
          super__Vector_impl_data._M_start != pMVar20) {
        piVar19 = pMVar20->refcount;
        if (piVar19 != (int *)0x0) {
          LOCK();
          *piVar19 = *piVar19 + 1;
          UNLOCK();
        }
        piVar19 = (_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                   super__Vector_impl_data._M_start)->refcount;
        if (piVar19 != (int *)0x0) {
          LOCK();
          *piVar19 = *piVar19 + -1;
          UNLOCK();
          if (*piVar19 == 0) {
            if ((_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                 super__Vector_impl_data._M_start)->allocator == (Allocator *)0x0) {
              free((_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                    super__Vector_impl_data._M_start)->data);
            }
            else {
              (*(_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                 super__Vector_impl_data._M_start)->allocator->_vptr_Allocator[3])();
            }
          }
        }
        pMVar9->cstep = 0;
        pMVar9->data = (void *)0x0;
        pMVar9->refcount = (int *)0x0;
        *(undefined8 *)((long)&pMVar9->refcount + 4) = 0;
        *(undefined8 *)((long)&pMVar9->elemsize + 4) = 0;
        pMVar9->c = 0;
        pMVar9->dims = 0;
        pMVar9->w = 0;
        pMVar9->h = 0;
        pMVar9->d = 0;
        piVar19 = pMVar20->refcount;
        pMVar9->data = pMVar20->data;
        pMVar9->refcount = piVar19;
        pMVar9->elemsize = pMVar20->elemsize;
        pMVar9->elempack = pMVar20->elempack;
        pMVar9->allocator = pMVar20->allocator;
        iVar31 = pMVar20->w;
        iVar16 = pMVar20->h;
        iVar24 = pMVar20->d;
        pMVar9->dims = pMVar20->dims;
        pMVar9->w = iVar31;
        pMVar9->h = iVar16;
        pMVar9->d = iVar24;
        pMVar9->c = pMVar20->c;
        pMVar9->cstep = pMVar20->cstep;
      }
      iVar16 = 1;
      iVar31 = pMVar20[1].w;
      if ((local_150->super_MatMul).transB == 0) {
        iVar16 = pMVar20[1].w;
        iVar31 = 1;
      }
      Mat::reshape(&local_1c8,pMVar25,iVar31,iVar16,(Allocator *)0x0);
      pOVar14 = local_100;
      piVar19 = (int *)CONCAT44(local_1c8.refcount._4_4_,local_1c8.refcount._0_4_);
      if (_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
          super__Vector_impl_data._M_start + 1 != &local_1c8) {
        if (piVar19 != (int *)0x0) {
          LOCK();
          *piVar19 = *piVar19 + 1;
          UNLOCK();
        }
        piVar19 = _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                  super__Vector_impl_data._M_start[1].refcount;
        if (piVar19 != (int *)0x0) {
          LOCK();
          *piVar19 = *piVar19 + -1;
          UNLOCK();
          if (*piVar19 == 0) {
            if (_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_start[1].allocator == (Allocator *)0x0) {
              free(_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                   super__Vector_impl_data._M_start[1].data);
            }
            else {
              (*(_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                 super__Vector_impl_data._M_start[1].allocator)->_vptr_Allocator[3])();
            }
          }
        }
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].data = local_1c8.data;
        piVar19 = (int *)CONCAT44(local_1c8.refcount._4_4_,local_1c8.refcount._0_4_);
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].refcount = piVar19;
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].elemsize =
             CONCAT44(local_1c8.elemsize._4_4_,(undefined4)local_1c8.elemsize);
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].elempack = local_1c8.elempack;
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].allocator = local_1c8.allocator;
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].dims = local_1c8.dims;
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].w = local_1c8.w;
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].h = local_1c8.h;
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].d = local_1c8.d;
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].c = local_1c8.c;
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].cstep = local_1c8.cstep;
      }
      if (piVar19 != (int *)0x0) {
        LOCK();
        *piVar19 = *piVar19 + -1;
        UNLOCK();
        if (*piVar19 == 0) {
          if (local_1c8.allocator == (Allocator *)0x0) {
            free(local_1c8.data);
          }
          else {
            (*(local_1c8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      (*local_150->gemm->_vptr_Layer[6])(local_150->gemm,&_bottom_blobs,top_blobs,pOVar14);
      Mat::reshape(&local_1c8,this_00,this_00->h,pOVar14->blob_allocator);
      piVar19 = (int *)CONCAT44(local_1c8.refcount._4_4_,local_1c8.refcount._0_4_);
      if (this_00 != &local_1c8) {
        if (piVar19 != (int *)0x0) {
          LOCK();
          *piVar19 = *piVar19 + 1;
          UNLOCK();
        }
        piVar19 = this_00->refcount;
        if (piVar19 != (int *)0x0) {
          LOCK();
          *piVar19 = *piVar19 + -1;
          UNLOCK();
          if (*piVar19 == 0) {
            if (this_00->allocator == (Allocator *)0x0) {
              free(this_00->data);
            }
            else {
              (*this_00->allocator->_vptr_Allocator[3])();
            }
          }
        }
        this_00->data = local_1c8.data;
        piVar19 = (int *)CONCAT44(local_1c8.refcount._4_4_,local_1c8.refcount._0_4_);
        this_00->refcount = piVar19;
        this_00->elemsize = CONCAT44(local_1c8.elemsize._4_4_,(undefined4)local_1c8.elemsize);
        this_00->elempack = local_1c8.elempack;
        this_00->allocator = local_1c8.allocator;
        this_00->dims = local_1c8.dims;
        this_00->w = local_1c8.w;
        this_00->h = local_1c8.h;
        this_00->d = local_1c8.d;
        this_00->c = local_1c8.c;
        this_00->cstep = local_1c8.cstep;
      }
      if (piVar19 == (int *)0x0) goto LAB_004e471f;
      LOCK();
      *piVar19 = *piVar19 + -1;
      UNLOCK();
      if (*piVar19 != 0) goto LAB_004e471f;
      if (local_1c8.allocator != (Allocator *)0x0) {
        (*(local_1c8.allocator)->_vptr_Allocator[3])();
        goto LAB_004e471f;
      }
    }
  }
  free(local_1c8.data);
LAB_004e471f:
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&_bottom_blobs);
  return 0;
}

Assistant:

int MatMul_x86::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& A = bottom_blobs[0];
    const Mat& B = bottom_blobs[1];
    Mat& top_blob = top_blobs[0];

    const int Adims = A.dims;
    const int Bdims = B.dims;
    const int max_ABdims = std::max(Adims, Bdims);
    const size_t elemsize = A.elemsize;

    if (Adims == 1 && Bdims == 1)
    {
        // dot product
        std::vector<Mat> _bottom_blobs(2);
        _bottom_blobs[0] = A.reshape(A.w, 1);
        _bottom_blobs[1] = transB ? B.reshape(B.w, 1) : B.reshape(1, B.w);
        gemm->forward(_bottom_blobs, top_blobs, opt);

        top_blob = top_blob.reshape(1, opt.blob_allocator);
    }
    else if (Adims == 2 && Bdims == 2)
    {
        // matrix multiply
        gemm->forward(bottom_blobs, top_blobs, opt);
    }
    else if (Adims == 1 && Bdims == 2)
    {
        // matrix multiply
        std::vector<Mat> _bottom_blobs(2);
        _bottom_blobs[0] = A.reshape(A.w, 1);
        _bottom_blobs[1] = B;
        gemm->forward(_bottom_blobs, top_blobs, opt);

        top_blob = top_blob.reshape(top_blob.w, opt.blob_allocator);
    }
    else if (Adims == 2 && Bdims == 1)
    {
        // matrix multiply
        std::vector<Mat> _bottom_blobs(2);
        _bottom_blobs[0] = A;
        _bottom_blobs[1] = transB ? B.reshape(B.w, 1) : B.reshape(1, B.w);
        gemm->forward(_bottom_blobs, top_blobs, opt);

        top_blob = top_blob.reshape(top_blob.h, opt.blob_allocator);
    }
    else if (Adims == 1 && Bdims > 2)
    {
        // batched matrix multiply
        const int N = transB == 0 ? B.w : B.h;
        const int batch_size = B.d * B.c;

        Mat top_blob1(N, 1, batch_size, elemsize, opt.blob_allocator);
        if (top_blob1.empty())
            return -100;

        Mat A1 = A.reshape(A.w, 1);
        Mat B1 = B.reshape(B.w, B.h, batch_size);

        for (int p = 0; p < batch_size; p++)
        {
            std::vector<Mat> _bottom_blobs(2);
            _bottom_blobs[0] = A1;
            _bottom_blobs[1] = B1.channel(p);
            std::vector<Mat> _top_blobs(1);
            _top_blobs[0] = top_blob1.channel(p);
            gemm->forward(_bottom_blobs, _top_blobs, opt);
        }

        if (Bdims == 3)
            top_blob = top_blob1.reshape(N, B.d * B.c, opt.blob_allocator);
        else
            top_blob = top_blob1.reshape(N, B.d, B.c, opt.blob_allocator);
    }
    else if (Adims > 2 && Bdims == 1)
    {
        // batched matrix multiply
        const int M = A.h;
        const int batch_size = A.d * A.c;

        Mat top_blob1(1, M, batch_size, elemsize, opt.blob_allocator);
        if (top_blob1.empty())
            return -100;

        Mat A1 = A.reshape(A.w, A.h, batch_size);
        Mat BT = transB ? B.reshape(B.w, 1) : B.reshape(1, B.w);

        for (int p = 0; p < batch_size; p++)
        {
            std::vector<Mat> _bottom_blobs(2);
            _bottom_blobs[0] = A1.channel(p);
            _bottom_blobs[1] = BT;
            std::vector<Mat> _top_blobs(1);
            _top_blobs[0] = top_blob1.channel(p);
            gemm->forward(_bottom_blobs, _top_blobs, opt);
        }

        if (Adims == 3)
            top_blob = top_blob1.reshape(M, A.d * A.c, opt.blob_allocator);
        else
            top_blob = top_blob1.reshape(M, A.d, A.c, opt.blob_allocator);
    }
    else if (max_ABdims == 3)
    {
        Mat A1 = Adims == 2 ? A.reshape(A.w, A.h, 1) : A;
        Mat B1 = Bdims == 2 ? B.reshape(B.w, B.h, 1) : B;

        const int M = A1.h;
        const int N = transB == 0 ? B1.w : B1.h;
        const int batch_size = std::max(A1.c, B1.c);

        top_blob.create(N, M, batch_size, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        for (int p = 0; p < batch_size; p++)
        {
            int Ap = A1.c == 1 ? 0 : p;
            int Bp = B1.c == 1 ? 0 : p;

            std::vector<Mat> _bottom_blobs(2);
            _bottom_blobs[0] = A1.channel(Ap);
            _bottom_blobs[1] = B1.channel(Bp);
            std::vector<Mat> _top_blobs(1);
            _top_blobs[0] = top_blob.channel(p);
            gemm->forward(_bottom_blobs, _top_blobs, opt);
        }
    }
    else if (max_ABdims == 4)
    {
        Mat A1 = Adims == 3 ? A.reshape(A.w, A.h, A.c, 1) : A;
        Mat B1 = Bdims == 3 ? B.reshape(B.w, B.h, B.c, 1) : B;

        const int M = A1.h;
        const int N = transB == 0 ? B1.w : B1.h;
        const int batch_size_d = std::max(A1.d, B1.d);
        const int batch_size_c = std::max(A1.c, B1.c);

        top_blob.create(N, M, batch_size_d, batch_size_c, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        for (int p = 0; p < batch_size_c; p++)
        {
            int Ap = A1.c == 1 ? 0 : p;
            int Bp = B1.c == 1 ? 0 : p;

            for (int q = 0; q < batch_size_d; q++)
            {
                int Ad = A1.d == 1 ? 0 : q;
                int Bd = B1.d == 1 ? 0 : q;

                std::vector<Mat> _bottom_blobs(2);
                _bottom_blobs[0] = A1.channel(Ap).depth(Ad);
                _bottom_blobs[1] = B1.channel(Bp).depth(Bd);
                std::vector<Mat> _top_blobs(1);
                _top_blobs[0] = top_blob.channel(p).depth(q);
                gemm->forward(_bottom_blobs, _top_blobs, opt);
            }
        }
    }
    else
    {
        NCNN_LOGE("impossible matmul %d %d", Adims, Bdims);
        return -1;
    }

    return 0;
}